

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O0

bool pstore::command_line::details::
     parse_positional_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                first_arg,
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               last_arg)

{
  option *this;
  bool bVar1;
  uint uVar2;
  int iVar3;
  options_container *__cont;
  const_iterator cVar4;
  reference ppoVar5;
  reference pbVar6;
  _Self *p_Var7;
  bool local_7a;
  option *handler;
  _Self local_40;
  _List_const_iterator<pstore::command_line::option_*> it;
  const_iterator end;
  anon_class_1_0_00000001_for__M_pred is_positional;
  options_container *all_options;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_18;
  bool ok;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  last_arg_local;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  first_arg_local;
  
  all_options._7_1_ = true;
  _Stack_18._M_current = last_arg._M_current;
  last_arg_local = first_arg;
  __cont = option::all_abi_cxx11_();
  it._M_node = (_List_node_base *)
               std::
               end<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                         (__cont);
  cVar4 = std::
          begin<std::__cxx11::list<pstore::command_line::option*,std::allocator<pstore::command_line::option*>>>
                    (__cont);
  local_40._M_node =
       (_List_node_base *)
       std::
       find_if<std::_List_const_iterator<pstore::command_line::option*>,pstore::command_line::details::parse_positional_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(pstore::command_line::option_const*)_1_>
                 (cVar4._M_node,it._M_node);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&last_arg_local,&stack0xffffffffffffffe8);
    local_7a = false;
    if (bVar1) {
      local_7a = std::operator!=(&local_40,&it);
    }
    if (local_7a == false) break;
    ppoVar5 = std::_List_const_iterator<pstore::command_line::option_*>::operator*(&local_40);
    this = *ppoVar5;
    uVar2 = (*this->_vptr_option[9])();
    if ((uVar2 & 1) == 0) {
      assert_failed("handler->is_positional ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/command_line.hpp"
                    ,300);
    }
    iVar3 = (*this->_vptr_option[0x10])();
    all_options._7_1_ = (bool)((byte)iVar3 & 1);
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&last_arg_local);
    uVar2 = (*this->_vptr_option[0xf])(this,pbVar6);
    if ((uVar2 & 1) == 0) {
      all_options._7_1_ = false;
    }
    bVar1 = option::can_accept_another_occurrence(this);
    if (!bVar1) {
      p_Var7 = std::_List_const_iterator<pstore::command_line::option_*>::operator++(&local_40);
      local_40._M_node =
           (_List_node_base *)
           std::
           find_if<std::_List_const_iterator<pstore::command_line::option*>,pstore::command_line::details::parse_positional_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>(__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::_lambda(pstore::command_line::option_const*)_1_>
                     (p_Var7->_M_node,it._M_node);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&last_arg_local);
  }
  return all_options._7_1_;
}

Assistant:

bool parse_positional_arguments (InputIterator first_arg, InputIterator last_arg) {
                bool ok = true;

                auto const & all_options = option::all ();
                auto const is_positional = [] (option const * const opt) {
                    return opt->is_positional ();
                };

                auto end = std::end (all_options);
                auto it = std::find_if (std::begin (all_options), end, is_positional);
                for (; first_arg != last_arg && it != end; ++first_arg) {
                    option * const handler = *it;
                    PSTORE_ASSERT (handler->is_positional ());
                    ok = handler->add_occurrence ();
                    if (!handler->value (*first_arg)) {
                        ok = false;
                    }
                    if (!handler->can_accept_another_occurrence ()) {
                        it = std::find_if (++it, end, is_positional);
                    }
                }
                return ok;
            }